

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5PoslistNext64(u8 *a,int n,int *pi,i64 *piOff)

{
  undefined4 in_EAX;
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVal;
  undefined8 uStack_38;
  
  iVar4 = *pi;
  if (n <= iVar4) {
LAB_001cd8cc:
    *piOff = -1;
    return 1;
  }
  uVar3 = *piOff;
  uStack_38 = (ulong)CONCAT14(a[iVar4],in_EAX);
  iVar1 = 1;
  if ((char)a[iVar4] < '\0') {
    iVar1 = sqlite3Fts5GetVarint32(a + iVar4,(u32 *)((long)&uStack_38 + 4));
  }
  iVar4 = iVar4 + iVar1;
  if (uStack_38._4_4_ < 2) {
    if (uStack_38._4_4_ == 0) goto LAB_001cd8f8;
    uStack_38 = (ulong)CONCAT14(a[iVar4],(undefined4)uStack_38);
    iVar1 = 1;
    if ((char)a[iVar4] < '\0') {
      iVar1 = sqlite3Fts5GetVarint32(a + iVar4,(u32 *)((long)&uStack_38 + 4));
    }
    uVar3 = uStack_38;
    iVar2 = 1;
    iVar1 = iVar1 + iVar4;
    uStack_38 = (ulong)CONCAT14(a[iVar1],(undefined4)uStack_38);
    if ((char)a[iVar1] < '\0') {
      iVar2 = sqlite3Fts5GetVarint32(a + iVar1,(u32 *)((long)&uStack_38 + 4));
    }
    if (uStack_38._4_4_ < 2) goto LAB_001cd8cc;
    uVar3 = uVar3 & 0xffffffff00000000;
    iVar4 = iVar2 + iVar1;
  }
  *piOff = (uStack_38._4_4_ + 0x7ffffffeU & 0x7fffffff) + uVar3;
LAB_001cd8f8:
  *pi = iVar4;
  return 0;
}

Assistant:

static int sqlite3Fts5PoslistNext64(
  const u8 *a, int n,             /* Buffer containing poslist */
  int *pi,                        /* IN/OUT: Offset within a[] */
  i64 *piOff                      /* IN/OUT: Current offset */
){
  int i = *pi;
  if( i>=n ){
    /* EOF */
    *piOff = -1;
    return 1;  
  }else{
    i64 iOff = *piOff;
    int iVal;
    fts5FastGetVarint32(a, i, iVal);
    if( iVal<=1 ){
      if( iVal==0 ){
        *pi = i;
        return 0;
      }
      fts5FastGetVarint32(a, i, iVal);
      iOff = ((i64)iVal) << 32;
      fts5FastGetVarint32(a, i, iVal);
      if( iVal<2 ){
        /* This is a corrupt record. So stop parsing it here. */
        *piOff = -1;
        return 1;
      }
    }
    *piOff = iOff + ((iVal-2) & 0x7FFFFFFF);
    *pi = i;
    return 0;
  }
}